

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BvhNode.cpp
# Opt level: O0

void __thiscall BVH_Node::Release(BVH_Node *this,Object *node)

{
  bool bVar1;
  BVH_Node *this_00;
  BVH_Node *in_RSI;
  BVH_Node *_node_bvh;
  BVH_Node *this_01;
  
  if (in_RSI != (BVH_Node *)0x0) {
    if (in_RSI == (BVH_Node *)0x0) {
      this_00 = (BVH_Node *)0x0;
    }
    else {
      this_00 = (BVH_Node *)__dynamic_cast(in_RSI,&Object::typeinfo,&typeinfo,0);
    }
    this_01 = this_00;
    bVar1 = IsLeaf(this_00);
    if (!bVar1) {
      GetNodeLeft(this_01);
      Release(in_RSI,&this_01->super_Object);
      GetNodeRight(this_01);
      Release(in_RSI,&this_01->super_Object);
    }
    bVar1 = IsRoot(this_01);
    if (!bVar1) {
      safe_delete<BVH_Node>((BVH_Node **)this_00);
    }
  }
  return;
}

Assistant:

void
BVH_Node::Release(Object *node)
{
    if(node == nullptr) {
        return;
    }

    BVH_Node *_node_bvh = dynamic_cast<BVH_Node *>(node);
    if(!_node_bvh->IsLeaf()) {
        Release(_node_bvh->GetNodeLeft());
        Release(_node_bvh->GetNodeRight());
    }
    
    if(!_node_bvh->IsRoot()) {
        safe_delete(_node_bvh);
    }
}